

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassSerializeBinaryField
          (Generator *this,GeneratorOptions *options,Printer *printer,FieldDescriptor *field)

{
  bool bVar1;
  CppType CVar2;
  Type TVar3;
  uint uVar4;
  char *pcVar5;
  GeneratorOptions *options_00;
  uint *value1;
  string *psVar6;
  int i;
  int i_00;
  FieldDescriptor *field_00;
  undefined1 in_R9B;
  BytesMode in_stack_fffffffffffffdd0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  GeneratorOptions *local_d0;
  FieldDescriptor *value_field;
  FieldDescriptor *key_field;
  string local_b8;
  string local_98;
  string local_68;
  undefined1 local_48 [8];
  string typed_annotation;
  FieldDescriptor *field_local;
  Printer *printer_local;
  GeneratorOptions *options_local;
  Generator *this_local;
  
  typed_annotation.field_2._8_8_ = field;
  bVar1 = anon_unknown_0::HasFieldPresence(options,field);
  if ((bVar1) &&
     (CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)typed_annotation.field_2._8_8_),
     CVar2 != CPPTYPE_MESSAGE)) {
    (anonymous_namespace)::JSFieldTypeAnnotation_abi_cxx11_
              ((string *)local_48,(_anonymous_namespace_ *)options,
               (GeneratorOptions *)typed_annotation.field_2._8_8_,(FieldDescriptor *)0x0,false,false
               ,false,in_stack_fffffffffffffdd0);
    (anonymous_namespace)::JSFieldIndex_abi_cxx11_
              (&local_68,(_anonymous_namespace_ *)typed_annotation.field_2._8_8_,field_00);
    value1 = (uint *)&local_68;
    io::Printer::Print(printer,
                       "  f = /** @type {$type$} */ (jspb.Message.getField(message, $index$));\n",
                       "index",(string *)value1,"type",(string *)local_48);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)local_48);
  }
  else {
    (anonymous_namespace)::JSGetterName_abi_cxx11_
              (&local_98,(_anonymous_namespace_ *)options,
               (GeneratorOptions *)typed_annotation.field_2._8_8_,(FieldDescriptor *)0x2,
               BYTES_DEFAULT,(bool)in_R9B);
    bVar1 = anon_unknown_0::IsMap(options,(FieldDescriptor *)typed_annotation.field_2._8_8_);
    pcVar5 = "";
    if (bVar1) {
      pcVar5 = "true";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b8,pcVar5,(allocator *)((long)&key_field + 7));
    value1 = (uint *)&local_98;
    io::Printer::Print(printer,"  f = message.get$name$($nolazy$);\n","name",(string *)value1,
                       "nolazy",&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&key_field + 7));
    std::__cxx11::string::~string((string *)&local_98);
  }
  bVar1 = anon_unknown_0::IsMap(options,(FieldDescriptor *)typed_annotation.field_2._8_8_);
  if (bVar1) {
    io::Printer::Print(printer,"  if (f && f.getLength() > 0) {\n");
  }
  else {
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)typed_annotation.field_2._8_8_);
    if (bVar1) {
      io::Printer::Print(printer,"  if (f.length > 0) {\n");
    }
    else {
      bVar1 = anon_unknown_0::HasFieldPresence
                        (options,(FieldDescriptor *)typed_annotation.field_2._8_8_);
      if (bVar1) {
        io::Printer::Print(printer,"  if (f != null) {\n");
      }
      else {
        CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)typed_annotation.field_2._8_8_);
        value1 = &switchD_0039d9da::switchdataD_005d44c4;
        switch(CVar2) {
        case CPPTYPE_INT32:
        case CPPTYPE_INT64:
        case CPPTYPE_UINT32:
        case CPPTYPE_UINT64:
          io::Printer::Print(printer,"  if (f !== 0) {\n");
          break;
        case CPPTYPE_DOUBLE:
        case CPPTYPE_FLOAT:
        case CPPTYPE_ENUM:
          io::Printer::Print(printer,"  if (f !== 0.0) {\n");
          break;
        case CPPTYPE_BOOL:
          io::Printer::Print(printer,"  if (f) {\n");
          break;
        case CPPTYPE_STRING:
          io::Printer::Print(printer,"  if (f.length > 0) {\n");
          break;
        default:
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
                        ,0xbbe,
                        "void google::protobuf::compiler::js::Generator::GenerateClassSerializeBinaryField(const GeneratorOptions &, io::Printer *, const FieldDescriptor *) const"
                       );
        }
      }
    }
  }
  bVar1 = anon_unknown_0::IsMap(options,(FieldDescriptor *)typed_annotation.field_2._8_8_);
  if (bVar1) {
    value_field = anon_unknown_0::MapFieldKey((FieldDescriptor *)typed_annotation.field_2._8_8_);
    local_d0 = (GeneratorOptions *)
               anon_unknown_0::MapFieldValue((FieldDescriptor *)typed_annotation.field_2._8_8_);
    uVar4 = FieldDescriptor::number((FieldDescriptor *)typed_annotation.field_2._8_8_);
    SimpleItoa_abi_cxx11_(&local_f0,(protobuf *)(ulong)uVar4,i);
    (anonymous_namespace)::JSBinaryWriterMethodName_abi_cxx11_
              (&local_110,(_anonymous_namespace_ *)options,(GeneratorOptions *)value_field,
               (FieldDescriptor *)value1);
    (anonymous_namespace)::JSBinaryWriterMethodName_abi_cxx11_
              (&local_130,(_anonymous_namespace_ *)options,local_d0,(FieldDescriptor *)value1);
    psVar6 = &local_f0;
    io::Printer::Print(printer,
                       "    f.serializeBinary($index$, writer, $keyWriterFn$, $valueWriterFn$",
                       "index",psVar6,"keyWriterFn",&local_110,"valueWriterFn",&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_f0);
    TVar3 = FieldDescriptor::type((FieldDescriptor *)local_d0);
    if (TVar3 == TYPE_MESSAGE) {
      options_00 = (GeneratorOptions *)FieldDescriptor::message_type((FieldDescriptor *)local_d0);
      (anonymous_namespace)::GetMessagePath_abi_cxx11_
                (&local_150,(_anonymous_namespace_ *)options,options_00,(Descriptor *)psVar6);
      io::Printer::Print(printer,", $messageType$.serializeBinaryToWriter","messageType",&local_150)
      ;
      std::__cxx11::string::~string((string *)&local_150);
    }
    io::Printer::Print(printer,");\n");
  }
  else {
    (anonymous_namespace)::JSBinaryReadWriteMethodName_abi_cxx11_
              (&local_170,(_anonymous_namespace_ *)typed_annotation.field_2._8_8_,
               (FieldDescriptor *)0x1,SUB81(value1,0));
    uVar4 = FieldDescriptor::number((FieldDescriptor *)typed_annotation.field_2._8_8_);
    SimpleItoa_abi_cxx11_(&local_190,(protobuf *)(ulong)uVar4,i_00);
    psVar6 = &local_170;
    io::Printer::Print(printer,"    writer.write$method$(\n      $index$,\n      f","method",psVar6,
                       "index",&local_190);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_170);
    CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)typed_annotation.field_2._8_8_);
    if ((CVar2 != CPPTYPE_MESSAGE) ||
       (bVar1 = anon_unknown_0::IsMap(options,(FieldDescriptor *)typed_annotation.field_2._8_8_),
       bVar1)) {
      io::Printer::Print(printer,"\n");
    }
    else {
      (anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
                (&local_1b0,(_anonymous_namespace_ *)options,
                 (GeneratorOptions *)typed_annotation.field_2._8_8_,(FieldDescriptor *)psVar6);
      io::Printer::Print(printer,",\n      $submsg$.serializeBinaryToWriter\n","submsg",&local_1b0);
      std::__cxx11::string::~string((string *)&local_1b0);
    }
    io::Printer::Print(printer,"    );\n");
  }
  io::Printer::Print(printer,"  }\n");
  return;
}

Assistant:

void Generator::GenerateClassSerializeBinaryField(
    const GeneratorOptions& options,
    io::Printer* printer,
    const FieldDescriptor* field) const {
  if (HasFieldPresence(options, field) &&
      field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
    string typed_annotation = JSFieldTypeAnnotation(
        options, field,
        /* is_setter_argument = */ false,
        /* force_present = */ false,
        /* singular_if_not_packed = */ false,
        /* bytes_mode = */ BYTES_DEFAULT);
    printer->Print(
        "  f = /** @type {$type$} */ "
        "(jspb.Message.getField(message, $index$));\n",
        "index", JSFieldIndex(field),
        "type", typed_annotation);
  } else {
    printer->Print(
        "  f = message.get$name$($nolazy$);\n",
        "name", JSGetterName(options, field, BYTES_U8),
        // No lazy creation for maps containers -- fastpath the empty case.
        "nolazy", IsMap(options, field) ? "true" : "");
  }

  // Print an `if (condition)` statement that evaluates to true if the field
  // goes on the wire.
  if (IsMap(options, field)) {
    printer->Print(
        "  if (f && f.getLength() > 0) {\n");
  } else if (field->is_repeated()) {
    printer->Print(
        "  if (f.length > 0) {\n");
  } else {
    if (HasFieldPresence(options, field)) {
      printer->Print(
          "  if (f != null) {\n");
    } else {
      // No field presence: serialize onto the wire only if value is
      // non-default.  Defaults are documented here:
      // https://goto.google.com/lhdfm
      switch (field->cpp_type()) {
        case FieldDescriptor::CPPTYPE_INT32:
        case FieldDescriptor::CPPTYPE_INT64:
        case FieldDescriptor::CPPTYPE_UINT32:
        case FieldDescriptor::CPPTYPE_UINT64: {
          {
            printer->Print("  if (f !== 0) {\n");
          }
          break;
        }

        case FieldDescriptor::CPPTYPE_ENUM:
        case FieldDescriptor::CPPTYPE_FLOAT:
        case FieldDescriptor::CPPTYPE_DOUBLE:
          printer->Print(
              "  if (f !== 0.0) {\n");
          break;
        case FieldDescriptor::CPPTYPE_BOOL:
          printer->Print(
              "  if (f) {\n");
          break;
        case FieldDescriptor::CPPTYPE_STRING:
          printer->Print(
              "  if (f.length > 0) {\n");
          break;
        default:
          assert(false);
          break;
      }
    }
  }

  // Write the field on the wire.
  if (IsMap(options, field)) {
    const FieldDescriptor* key_field = MapFieldKey(field);
    const FieldDescriptor* value_field = MapFieldValue(field);
    printer->Print(
        "    f.serializeBinary($index$, writer, "
                              "$keyWriterFn$, $valueWriterFn$",
        "index", SimpleItoa(field->number()),
        "keyWriterFn", JSBinaryWriterMethodName(options, key_field),
        "valueWriterFn", JSBinaryWriterMethodName(options, value_field));

    if (value_field->type() == FieldDescriptor::TYPE_MESSAGE) {
      printer->Print(", $messageType$.serializeBinaryToWriter",
          "messageType", GetMessagePath(options, value_field->message_type()));
    }

    printer->Print(");\n");
  } else {
    printer->Print(
        "    writer.write$method$(\n"
        "      $index$,\n"
        "      f",
        "method", JSBinaryReadWriteMethodName(field, /* is_writer = */ true),
        "index", SimpleItoa(field->number()));

    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
        !IsMap(options, field)) {
      printer->Print(
          ",\n"
          "      $submsg$.serializeBinaryToWriter\n",
        "submsg", SubmessageTypeRef(options, field));
    } else {
      printer->Print("\n");
    }

    printer->Print(
        "    );\n");
  }

  // Close the `if`.
  printer->Print(
      "  }\n");
}